

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationMatrix<-1,_-1,_int>::operator=
          (PermutationMatrix<_1,__1,_int> *this,PermutationMatrix<_1,__1,_int> *other)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  undefined8 uVar5;
  Index index;
  ulong uVar6;
  long lVar7;
  ActualDstType actualDst;
  ulong rows;
  
  piVar3 = (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  rows = (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
  if ((this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != rows) {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,rows,1);
    rows = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  }
  piVar4 = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar6 = rows + 3;
  if (-1 < (long)rows) {
    uVar6 = rows;
  }
  uVar6 = uVar6 & 0xfffffffffffffffc;
  if (3 < (long)rows) {
    lVar7 = 0;
    do {
      piVar1 = piVar3 + lVar7;
      uVar5 = *(undefined8 *)(piVar1 + 2);
      piVar2 = piVar4 + lVar7;
      *(undefined8 *)piVar2 = *(undefined8 *)piVar1;
      *(undefined8 *)(piVar2 + 2) = uVar5;
      lVar7 = lVar7 + 4;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < (long)rows) {
    do {
      piVar4[uVar6] = piVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (rows != uVar6);
  }
  return this;
}

Assistant:

PermutationMatrix& operator=(const PermutationMatrix& other)
    {
      m_indices = other.m_indices;
      return *this;
    }